

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O2

void __thiscall
QPixmapConvolutionFilter::draw
          (QPixmapConvolutionFilter *this,QPainter *painter,QPointF *p,QPixmap *src,QRectF *srcRect)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  Representation RVar5;
  long *plVar6;
  QImage *destImage;
  long lVar7;
  qreal *pqVar8;
  QTransform *pQVar9;
  QPointF *destImage_00;
  long in_FS_OFFSET;
  byte bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  QRect QVar17;
  QRect QVar18;
  QPointF local_e8;
  qreal local_d8;
  qreal qStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  QPointF local_a8;
  undefined1 *local_98;
  double dStack_90;
  QTransform mat;
  
  bVar10 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  cVar3 = QPainter::isActive();
  if ((((cVar3 == '\0') || (*(int *)(lVar2 + 0x88) < 1)) || (*(int *)(lVar2 + 0x8c) < 1)) ||
     (cVar3 = QPixmap::isNull(), cVar3 != '\0')) goto LAB_003777b8;
  QPainter::paintEngine();
  plVar6 = (long *)QPaintEngine::paintDevice();
  iVar4 = (**(code **)(*plVar6 + 0x10))(plVar6);
  if (iVar4 == 3) {
    QPainter::paintEngine();
    destImage = (QImage *)QPaintEngine::paintDevice();
    pqVar8 = (qreal *)&DAT_00653438;
    pQVar9 = &mat;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pQVar9->m_matrix[0][0] = *pqVar8;
      pqVar8 = pqVar8 + (ulong)bVar10 * -2 + 1;
      pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    QPainter::combinedTransform();
    iVar4 = QTransform::type();
    if (1 < iVar4) goto LAB_003775b2;
    QPainter::paintEngine();
    iVar4 = QRasterPaintEngine::clipType();
    if (iVar4 == 1) goto LAB_003775b2;
    local_98 = (undefined1 *)0xffffffffffffffff;
    dStack_90 = -NAN;
    local_a8.xp = -NAN;
    local_a8.yp = -NAN;
    QRasterPaintEngine::clipBoundingRect();
    local_b8 = 0xffffffff;
    uStack_b4 = 0xffffffff;
    uStack_b0 = 0xffffffff;
    uStack_ac = 0xffffffff;
    local_c8 = 0xffffffff;
    uStack_c4 = 0xffffffff;
    uStack_c0 = 0xffffffff;
    uStack_bc = 0xffffffff;
    if ((srcRect->w <= 0.0) || (srcRect->h <= 0.0)) {
      auVar16 = QPixmap::rect();
      local_e8.xp = (qreal)auVar16._0_4_;
      local_e8.yp = (qreal)auVar16._4_4_;
      local_d8 = (qreal)(((long)auVar16._8_4_ - (long)auVar16._0_4_) + 1);
      qStack_d0 = (qreal)(((auVar16._8_8_ >> 0x20) - (auVar16._0_8_ >> 0x20)) + 1);
    }
    else {
      local_e8.xp = srcRect->xp;
      local_e8.yp = srcRect->yp;
      local_d8 = srcRect->w;
      qStack_d0 = srcRect->h;
    }
    (**(code **)(*(long *)&this->super_QPixmapFilter + 0x60))(&local_c8,this,&local_e8);
    lVar7 = QPainter::deviceTransform();
    local_e8.xp = p->xp + *(double *)(lVar7 + 0x30) + (double)CONCAT44(uStack_c4,local_c8);
    local_e8.yp = p->yp + *(double *)(lVar7 + 0x38) + (double)CONCAT44(uStack_bc,uStack_c0);
    local_d8 = (qreal)CONCAT44(uStack_b4,local_b8);
    qStack_d0 = (qreal)CONCAT44(uStack_ac,uStack_b0);
    cVar3 = QRectF::contains((QRectF *)&local_a8);
    if ((cVar3 == '\0') || (destImage == (QImage *)0x0)) goto LAB_003775b2;
    lVar7 = QPainter::deviceTransform();
    local_a8.xp = p->xp + *(double *)(lVar7 + 0x30);
    local_a8.yp = p->yp + *(double *)(lVar7 + 0x38);
    destImage_00 = (QPointF *)&mat;
    QPixmap::toImage();
    convolute(destImage,&local_a8,(QImage *)destImage_00,srcRect,CompositionMode_SourceOver,
              *(qreal **)(lVar2 + 0x80),*(int *)(lVar2 + 0x88),*(int *)(lVar2 + 0x8c));
  }
  else {
LAB_003775b2:
    if ((srcRect->w != 0.0) || (((NAN(srcRect->w) || (srcRect->h != 0.0)) || (NAN(srcRect->h))))) {
      QVar17 = QRectF::toRect(srcRect);
    }
    else {
      QVar17 = (QRect)QPixmap::rect();
    }
    RVar5 = QVar17.x1.m_i;
    dVar11 = (double)QVar17.y1.m_i.m_i;
    dVar12 = (double)(((long)QVar17.x2.m_i.m_i - (long)RVar5.m_i) + 1);
    dVar13 = (double)(((QVar17._8_8_ >> 0x20) - (QVar17._0_8_ >> 0x20)) + 1);
    local_a8.xp = (double)RVar5.m_i;
    local_a8.yp = dVar11;
    local_98 = (undefined1 *)dVar12;
    dStack_90 = dVar13;
    (**(code **)(*(long *)&this->super_QPixmapFilter + 0x60))((QRectF *)&mat,this,&local_a8);
    QVar18 = QRectF::toRect((QRectF *)&mat);
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    mat.m_matrix[0][0] =
         (qreal)CONCAT44((QVar18.y2.m_i.m_i - QVar18.y1.m_i) + 1,
                         (QVar18.x2.m_i.m_i - QVar18.x1.m_i) + 1);
    QImage::QImage((QImage *)&local_a8,(QSize *)&mat,Format_ARGB32_Premultiplied);
    QPixmap::toImage();
    dVar14 = (double)(RVar5.m_i - QVar18.x1.m_i);
    dVar15 = (double)(QVar17.y1.m_i.m_i - QVar18.y1.m_i);
    destImage_00 = &local_a8;
    local_e8.xp = dVar14;
    local_e8.yp = dVar15;
    mat.m_matrix[0][0] = (double)RVar5.m_i;
    mat.m_matrix[0][1] = dVar11;
    mat.m_matrix[0][2] = dVar12;
    mat.m_matrix[1][0] = dVar13;
    convolute((QImage *)destImage_00,&local_e8,(QImage *)&local_c8,(QRectF *)&mat,
              CompositionMode_Source,*(qreal **)(lVar2 + 0x80),*(int *)(lVar2 + 0x88),
              *(int *)(lVar2 + 0x8c));
    QImage::~QImage((QImage *)&local_c8);
    mat.m_matrix[0][0] = p->xp - dVar14;
    mat.m_matrix[0][1] = p->yp - dVar15;
    QPainter::drawImage((QPointF *)painter,(QImage *)&mat);
  }
  QImage::~QImage((QImage *)destImage_00);
LAB_003777b8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapConvolutionFilter::draw(QPainter *painter, const QPointF &p, const QPixmap &src, const QRectF& srcRect) const
{
    Q_D(const QPixmapConvolutionFilter);
    if (!painter->isActive())
        return;

    if (d->kernelWidth<=0 || d->kernelHeight <= 0)
        return;

    if (src.isNull())
        return;

    // raster implementation

    QImage *target = nullptr;
    if (painter->paintEngine()->paintDevice()->devType() == QInternal::Image) {
        target = static_cast<QImage *>(painter->paintEngine()->paintDevice());

        QTransform mat = painter->combinedTransform();

        if (mat.type() > QTransform::TxTranslate) {
            // Disabled because of transformation...
            target = nullptr;
        } else {
            QRasterPaintEngine *pe = static_cast<QRasterPaintEngine *>(painter->paintEngine());
            if (pe->clipType() == QRasterPaintEngine::ComplexClip)
                // disabled because of complex clipping...
                target = nullptr;
            else {
                QRectF clip = pe->clipBoundingRect();
                QRectF rect = boundingRectFor(srcRect.isEmpty() ? src.rect() : srcRect);
                QTransform x = painter->deviceTransform();
                if (!clip.contains(rect.translated(x.dx() + p.x(), x.dy() + p.y()))) {
                    target = nullptr;
                }

            }
        }
    }

    if (target) {
        QTransform x = painter->deviceTransform();
        QPointF offset(x.dx(), x.dy());

        convolute(target, p+offset, src.toImage(), srcRect, QPainter::CompositionMode_SourceOver, d->convolutionKernel, d->kernelWidth, d->kernelHeight);
    } else {
        QRect srect = srcRect.isNull() ? src.rect() : srcRect.toRect();
        QRect rect = boundingRectFor(srect).toRect();
        QImage result = QImage(rect.size(), QImage::Format_ARGB32_Premultiplied);
        QPoint offset = srect.topLeft() - rect.topLeft();
        convolute(&result,
                  offset,
                  src.toImage(),
                  srect,
                  QPainter::CompositionMode_Source,
                  d->convolutionKernel,
                  d->kernelWidth,
                  d->kernelHeight);
        painter->drawImage(p - offset, result);
    }
}